

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
antlr::BitSet::toArray(BitSet *this)

{
  const_reference cVar1;
  value_type_conflict4 *__x;
  value_type_conflict4 *pvVar2;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *elems;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__n;
  undefined4 local_18;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  __n = in_RDI;
  this_00 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x207fcf);
  local_18 = 0;
  while( true ) {
    __x = (value_type_conflict4 *)(ulong)local_18;
    pvVar2 = (value_type_conflict4 *)std::vector<bool,_std::allocator<bool>_>::size(this_00);
    if (pvVar2 <= __x) break;
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RSI,(size_type)__n);
    if (cVar1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(in_RDI,__x);
    }
    local_18 = local_18 + 1;
  }
  return __n;
}

Assistant:

vector<unsigned int> BitSet::toArray() const
{
	ANTLR_USE_NAMESPACE(std)vector<unsigned int> elems;
	for (unsigned int i = 0; i < storage.size(); i++)
	{
		if (storage[i])
			elems.push_back(i);
	}

	return elems;
}